

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O2

bool group_like(Am_Object *object)

{
  bool bVar1;
  bool bVar2;
  Am_Object AStack_28;
  Am_Object local_20;
  
  bVar1 = Am_Is_Group_Or_Map(object);
  bVar2 = true;
  if (!bVar1) {
    Am_Object::Am_Object(&local_20,&Am_Window);
    bVar1 = Am_Object::Is_Instance_Of(object,&local_20);
    bVar2 = true;
    if (!bVar1) {
      Am_Object::Am_Object(&AStack_28,&Am_Screen);
      bVar2 = Am_Object::Is_Instance_Of(object,&AStack_28);
      Am_Object::~Am_Object(&AStack_28);
    }
    Am_Object::~Am_Object(&local_20);
  }
  return bVar2;
}

Assistant:

inline bool
group_like(Am_Object object)
{
  return (Am_Is_Group_Or_Map(object) || object.Is_Instance_Of(Am_Window) ||
          object.Is_Instance_Of(Am_Screen));
}